

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recognition.cpp
# Opt level: O0

int __thiscall
TUPU::Recognition::performWithPath
          (Recognition *this,string *secretId,string *result,long *statusCode,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *images,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *tags,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sequenceIds)

{
  char *pcVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  shared_ptr<TUPU::TImage> image;
  char *sequenceId;
  char *tag;
  uint i;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> imgList;
  long *in_stack_000002f8;
  string *in_stack_00000300;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  *in_stack_00000308;
  string *in_stack_00000310;
  Recognition *in_stack_00000318;
  string *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  element_type *in_stack_fffffffffffffed8;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  *in_stack_fffffffffffffee0;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [64];
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> *local_60;
  char *local_58;
  uint local_4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  vector((vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> *)
         0x1a46b9);
  local_4c = 0;
  local_58 = (char *)0x0;
  local_60 = (vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
              *)0x0;
  while( true ) {
    uVar4 = (ulong)local_4c;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_28);
    if (sVar3 <= uVar4) break;
    std::make_shared<TUPU::TImage>();
    std::__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a4722);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_28,(ulong)local_4c);
    TImage::setPath((TImage *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    in_stack_fffffffffffffec8);
    uVar4 = (ulong)local_4c;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_30);
    if (uVar4 < sVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_30,(ulong)local_4c);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_30,(ulong)local_4c);
        local_58 = (char *)std::__cxx11::string::c_str();
      }
    }
    if (local_58 != (char *)0x0) {
      std::__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a480a);
      pcVar1 = local_58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
      TImage::setTag((TImage *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    uVar4 = (ulong)local_4c;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_stack_00000008);
    if (uVar4 < sVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_stack_00000008,(ulong)local_4c);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_stack_00000008,(ulong)local_4c);
        local_60 = (vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
                    *)std::__cxx11::string::c_str();
      }
    }
    if (local_60 !=
        (vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> *)
        0x0) {
      in_stack_fffffffffffffed8 =
           std::__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x1a494a);
      in_stack_fffffffffffffee0 = local_60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,(char *)in_stack_fffffffffffffee0,&local_c9);
      TImage::setSequenceId
                ((TImage *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
    push_back(in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    local_4c = local_4c + 1;
    std::shared_ptr<TUPU::TImage>::~shared_ptr((shared_ptr<TUPU::TImage> *)0x1a4a1d);
  }
  iVar2 = perform(in_stack_00000318,in_stack_00000310,in_stack_00000308,in_stack_00000300,
                  in_stack_000002f8);
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  ~vector(in_stack_fffffffffffffee0);
  return iVar2;
}

Assistant:

int Recognition::performWithPath(const string & secretId, string & result, long *statusCode,
    const vector<string> & images, const vector<string> & tags,
    const std::vector<std::string> & sequenceIds)
{
    vector<shared_ptr<TImage>> imgList;

    unsigned int i = 0;
    const char * tag = NULL;
    const char * sequenceId = NULL;
    while (i < images.size())
    {
        shared_ptr<TImage> image = std::make_shared<TImage>();
        image->setPath(images[i]);

        if (i < tags.size() && !tags[i].empty())
            tag = tags[i].c_str();
        if (tag)
            image->setTag(tag);

        if (i < sequenceIds.size() && !sequenceIds[i].empty())
            sequenceId = sequenceIds[i].c_str();
        if (sequenceId)
            image->setSequenceId(sequenceId);

        imgList.push_back(image);

        i++;
    }

    return perform(secretId, imgList, result, statusCode);
}